

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

void __thiscall
edition_unittest::TestNestedMessageHasBits_NestedMessage::~TestNestedMessageHasBits_NestedMessage
          (TestNestedMessageHasBits_NestedMessage *this)

{
  ~TestNestedMessageHasBits_NestedMessage(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TestNestedMessageHasBits_NestedMessage::~TestNestedMessageHasBits_NestedMessage() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestNestedMessageHasBits.NestedMessage)
  SharedDtor(*this);
}